

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walCleanupHash(Wal *pWal)

{
  int iVar1;
  int local_30;
  int i;
  int nByte;
  int iLimit;
  u32 iZero;
  u32 *aPgno;
  ht_slot *aHash;
  Wal *pWal_local;
  
  aPgno = (u32 *)0x0;
  _iLimit = (u32 *)0x0;
  nByte = 0;
  if ((pWal->hdr).mxFrame != 0) {
    aHash = (ht_slot *)pWal;
    iVar1 = walFramePage((pWal->hdr).mxFrame);
    walHashGet(pWal,iVar1,(ht_slot **)&aPgno,(u32 **)&iLimit,(u32 *)&nByte);
    iVar1 = *(int *)(aHash + 0x2c) - nByte;
    for (local_30 = 0; local_30 < 0x2000; local_30 = local_30 + 1) {
      if (iVar1 < (int)(uint)*(ushort *)((long)aPgno + (long)local_30 * 2)) {
        *(undefined2 *)((long)aPgno + (long)local_30 * 2) = 0;
      }
    }
    memset(_iLimit + (iVar1 + 1),0,(long)((int)aPgno - ((int)_iLimit + (iVar1 + 1) * 4)));
  }
  return;
}

Assistant:

static void walCleanupHash(Wal *pWal){
  volatile ht_slot *aHash = 0;    /* Pointer to hash table to clear */
  volatile u32 *aPgno = 0;        /* Page number array for hash table */
  u32 iZero = 0;                  /* frame == (aHash[x]+iZero) */
  int iLimit = 0;                 /* Zero values greater than this */
  int nByte;                      /* Number of bytes to zero in aPgno[] */
  int i;                          /* Used to iterate through aHash[] */

  assert( pWal->writeLock );
  testcase( pWal->hdr.mxFrame==HASHTABLE_NPAGE_ONE-1 );
  testcase( pWal->hdr.mxFrame==HASHTABLE_NPAGE_ONE );
  testcase( pWal->hdr.mxFrame==HASHTABLE_NPAGE_ONE+1 );

  if( pWal->hdr.mxFrame==0 ) return;

  /* Obtain pointers to the hash-table and page-number array containing 
  ** the entry that corresponds to frame pWal->hdr.mxFrame. It is guaranteed
  ** that the page said hash-table and array reside on is already mapped.
  */
  assert( pWal->nWiData>walFramePage(pWal->hdr.mxFrame) );
  assert( pWal->apWiData[walFramePage(pWal->hdr.mxFrame)] );
  walHashGet(pWal, walFramePage(pWal->hdr.mxFrame), &aHash, &aPgno, &iZero);

  /* Zero all hash-table entries that correspond to frame numbers greater
  ** than pWal->hdr.mxFrame.
  */
  iLimit = pWal->hdr.mxFrame - iZero;
  assert( iLimit>0 );
  for(i=0; i<HASHTABLE_NSLOT; i++){
    if( aHash[i]>iLimit ){
      aHash[i] = 0;
    }
  }
  
  /* Zero the entries in the aPgno array that correspond to frames with
  ** frame numbers greater than pWal->hdr.mxFrame. 
  */
  nByte = (int)((char *)aHash - (char *)&aPgno[iLimit+1]);
  memset((void *)&aPgno[iLimit+1], 0, nByte);

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* Verify that the every entry in the mapping region is still reachable
  ** via the hash table even after the cleanup.
  */
  if( iLimit ){
    int j;           /* Loop counter */
    int iKey;        /* Hash key */
    for(j=1; j<=iLimit; j++){
      for(iKey=walHash(aPgno[j]); aHash[iKey]; iKey=walNextHash(iKey)){
        if( aHash[iKey]==j ) break;
      }
      assert( aHash[iKey]==j );
    }
  }
#endif /* SQLITE_ENABLE_EXPENSIVE_ASSERT */
}